

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O1

uint32_t FACTWave_Stop(FACTWave *pWave,uint32_t dwFlags)

{
  FACTAudioEngine *pFVar1;
  FACTNotification note;
  FACTNotification local_41;
  
  if (pWave != (FACTWave *)0x0) {
    FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);
    if (((dwFlags & 1) == 0) && ((pWave->state & 0x40) == 0)) {
      pWave->state = pWave->state | 0x10;
      FAudioSourceVoice_ExitLoop(pWave->voice,0);
    }
    else {
      pWave->state = pWave->state & 0xffffff87 | 0x20;
      FAudioSourceVoice_Stop(pWave->voice,0,0);
      FAudioSourceVoice_FlushSourceBuffers(pWave->voice);
    }
    if ((pWave->parentBank->parentEngine->notifications & NOTIFY_WAVESTOP) != 0) {
      local_41.type = '\x0e';
      pFVar1 = pWave->parentBank->parentEngine;
      if ((pFVar1->notifications & NOTIFY_WAVESTOP) != 0) {
        local_41.pvContext = pFVar1->wave_context;
      }
      local_41.field_3.wave.pWave = pWave;
      (*pFVar1->notificationCallback)(&local_41);
    }
    FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
    return 0;
  }
  return 1;
}

Assistant:

uint32_t FACTWave_Stop(FACTWave *pWave, uint32_t dwFlags)
{
	if (pWave == NULL)
	{
		return 1;
	}
	FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);

	/* There are two ways that a Wave might be stopped immediately:
	 * 1. The program explicitly asks for it
	 * 2. The Wave is paused and therefore we can't do fade/release effects
	 */
	if (	dwFlags & FACT_FLAG_STOP_IMMEDIATE ||
		pWave->state & FACT_STATE_PAUSED	)
	{
		pWave->state |= FACT_STATE_STOPPED;
		pWave->state &= ~(
			FACT_STATE_PLAYING |
			FACT_STATE_STOPPING |
			FACT_STATE_PAUSED
		);
		FAudioSourceVoice_Stop(pWave->voice, 0, 0);
		FAudioSourceVoice_FlushSourceBuffers(pWave->voice);
	}
	else
	{
		pWave->state |= FACT_STATE_STOPPING;
		FAudioSourceVoice_ExitLoop(pWave->voice, 0);
	}

	if (pWave->parentBank->parentEngine->notifications & NOTIFY_WAVESTOP)
	{
		FACTNotification note;
		note.type = FACTNOTIFICATIONTYPE_WAVESTOP;
		note.wave.pWave = pWave;
		if (pWave->parentBank->parentEngine->notifications & NOTIFY_WAVESTOP)
		{
			note.pvContext = pWave->parentBank->parentEngine->wave_context;
		}
		pWave->parentBank->parentEngine->notificationCallback(&note);
	}

	FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
	return 0;
}